

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::Histogram
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          HistogramForm4 histogram,Image *image)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*histogram)(image,0,0,image->_width,image->_height,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector < uint32_t > Histogram( FunctionTable::HistogramForm4 histogram,
                                        const Image & image )
    {
        std::vector < uint32_t > histogramTable;

        histogram( image, 0, 0, image.width(), image.height(), histogramTable );

        return histogramTable;
    }